

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSwapchainImageBaseHeader *value)

{
  pointer pbVar1;
  int iVar2;
  XrResult XVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *enabled_extension;
  pointer pbVar4;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_88;
  string error_str;
  string local_50;
  
  if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
LAB_00159e0b:
      XVar3 = ValidateXrStruct(instance_info,command_name,objects_info,false,false,
                               (XrSwapchainImageOpenGLKHR *)value);
      return XVar3;
    }
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = (instance_info->enabled_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      iVar2 = std::__cxx11::string::compare((char *)pbVar4);
      if (iVar2 == 0) goto LAB_00159e0b;
    }
    error_str._M_dataplus._M_p = (pointer)&error_str.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_str,"XrSwapchainImageBaseHeader being used with child struct type ",
               "");
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"VUID-XrSwapchainImageBaseHeader-type-type","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_88,objects_info);
    CoreValidLogMessage(instance_info,&local_50,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_88,&error_str);
    if (local_88.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_str._M_dataplus._M_p != &error_str.field_2) {
      operator_delete(error_str._M_dataplus._M_p,error_str.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSwapchainImageBaseHeader",value->type,
               "VUID-XrSwapchainImageBaseHeader-type-type",XR_TYPE_UNKNOWN,"");
  }
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSwapchainImageBaseHeader* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrSwapchainImageBaseHeader-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrSwapchainImageBaseHeader-next-next" because it is a base structure
#if defined(XR_USE_GRAPHICS_API_OPENGL)
    if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR) {
        const XrSwapchainImageOpenGLKHR* new_value = reinterpret_cast<const XrSwapchainImageOpenGLKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_opengl_enable")) {
            std::string error_str = "XrSwapchainImageBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_KHR\"";
            error_str += " which requires extension \"XR_KHR_opengl_enable\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSwapchainImageBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL)
#if defined(XR_USE_GRAPHICS_API_OPENGL_ES)
    if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_ES_KHR) {
        const XrSwapchainImageOpenGLESKHR* new_value = reinterpret_cast<const XrSwapchainImageOpenGLESKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_opengl_es_enable")) {
            std::string error_str = "XrSwapchainImageBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_SWAPCHAIN_IMAGE_OPENGL_ES_KHR\"";
            error_str += " which requires extension \"XR_KHR_opengl_es_enable\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSwapchainImageBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
#endif // defined(XR_USE_GRAPHICS_API_OPENGL_ES)
#if defined(XR_USE_GRAPHICS_API_VULKAN)
    if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_VULKAN_KHR) {
        const XrSwapchainImageVulkanKHR* new_value = reinterpret_cast<const XrSwapchainImageVulkanKHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_vulkan_enable")) {
            std::string error_str = "XrSwapchainImageBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_SWAPCHAIN_IMAGE_VULKAN_KHR\"";
            error_str += " which requires extension \"XR_KHR_vulkan_enable\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSwapchainImageBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
#endif // defined(XR_USE_GRAPHICS_API_VULKAN)
#if defined(XR_USE_GRAPHICS_API_D3D11)
    if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_D3D11_KHR) {
        const XrSwapchainImageD3D11KHR* new_value = reinterpret_cast<const XrSwapchainImageD3D11KHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_D3D11_enable")) {
            std::string error_str = "XrSwapchainImageBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_SWAPCHAIN_IMAGE_D3D11_KHR\"";
            error_str += " which requires extension \"XR_KHR_D3D11_enable\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSwapchainImageBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
#endif // defined(XR_USE_GRAPHICS_API_D3D11)
#if defined(XR_USE_GRAPHICS_API_D3D12)
    if (value->type == XR_TYPE_SWAPCHAIN_IMAGE_D3D12_KHR) {
        const XrSwapchainImageD3D12KHR* new_value = reinterpret_cast<const XrSwapchainImageD3D12KHR*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_KHR_D3D12_enable")) {
            std::string error_str = "XrSwapchainImageBaseHeader being used with child struct type ";
            error_str += "\"XR_TYPE_SWAPCHAIN_IMAGE_D3D12_KHR\"";
            error_str += " which requires extension \"XR_KHR_D3D12_enable\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSwapchainImageBaseHeader-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
#endif // defined(XR_USE_GRAPHICS_API_D3D12)
    InvalidStructureType(instance_info, command_name, objects_info, "XrSwapchainImageBaseHeader",
                         value->type, "VUID-XrSwapchainImageBaseHeader-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}